

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::PrimitiveFieldGenerator::GenerateSerializationCode
          (PrimitiveFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  Printer *printer_local;
  PrimitiveFieldGenerator *this_local;
  
  bVar1 = FieldDescriptor::is_required(this->descriptor_);
  if ((!bVar1) || (bVar1 = Params::generate_has((this->super_FieldGenerator).params_), bVar1)) {
    GenerateSerializationConditional(this,printer);
    io::Printer::Print(printer,&this->variables_,
                       "  output.write$capitalized_type$($number$, this.$name$);\n}\n");
  }
  else {
    io::Printer::Print(printer,&this->variables_,
                       "output.write$capitalized_type$($number$, this.$name$);\n");
  }
  return;
}

Assistant:

void PrimitiveFieldGenerator::
GenerateSerializationCode(io::Printer* printer) const {
  if (descriptor_->is_required() && !params_.generate_has()) {
    // Always serialize a required field if we don't have the 'has' signal.
    printer->Print(variables_,
      "output.write$capitalized_type$($number$, this.$name$);\n");
  } else {
    GenerateSerializationConditional(printer);
    printer->Print(variables_,
      "  output.write$capitalized_type$($number$, this.$name$);\n"
      "}\n");
  }
}